

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O2

String * __thiscall
cplus::utils::Stack<int>::toString(String *__return_storage_ptr__,Stack<int> *this)

{
  StringBuilder stringBuilder;
  StringBuilder local_38;
  
  local_38.value._M_dataplus._M_p = (pointer)&local_38.value.field_2;
  local_38.super_Object._vptr_Object = (_func_int **)&PTR_toString_00128620;
  local_38.value._M_string_length = 0;
  local_38.value.field_2._M_local_buf[0] = '\0';
  StringBuilder::append(&local_38,"cplus::utils::Stack(");
  StringBuilder::append(&local_38,"stack size:");
  StringBuilder::append(&local_38,(ulong)this->stackSize);
  StringBuilder::append(&local_38,")");
  StringBuilder::toString(__return_storage_ptr__,&local_38);
  StringBuilder::~StringBuilder(&local_38);
  return __return_storage_ptr__;
}

Assistant:

inline ::cplus::lang::String toString() const override {
				StringBuilder stringBuilder;
				stringBuilder.append("cplus::utils::Stack(");
				stringBuilder.append("stack size:");
				stringBuilder.append((long) size());
				stringBuilder.append(")");
				return stringBuilder.toString();
			}